

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::CheckDoString(Debugger *this)

{
  bool bVar1;
  lua_State *L;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *code;
  pointer pbVar5;
  
  L = this->currentL;
  if ((L == (lua_State *)0x0) ||
     ((this->doStringList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->doStringList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    return;
  }
  bVar1 = this->skipHook;
  this->skipHook = true;
  iVar3 = (*lua_gettop)(L);
  pbVar2 = (this->doStringList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->doStringList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    iVar4 = (*luaL_loadstring)(L,(pbVar5->_M_dataplus)._M_p);
    if (iVar4 == 0) {
      lua_pcall(L,0,0,0);
    }
    (*lua_settop)(L,iVar3);
  }
  this->skipHook = bVar1;
  iVar4 = (*lua_gettop)(L);
  if (iVar4 == iVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->doStringList);
    return;
  }
  __assert_fail("lua_gettop(L) == t",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                ,0x371,"void Debugger::CheckDoString()");
}

Assistant:

void Debugger::CheckDoString() {
	if (!currentL) {
		return;
	}

	auto L = currentL;


	if (!doStringList.empty()) {
		const auto skip = skipHook;
		skipHook = true;
		const int t = lua_gettop(L);
		for (const auto &code: doStringList) {
			const int r = luaL_loadstring(L, code.c_str());
			if (r == LUA_OK) {
				lua_pcall(L, 0, 0, 0);
			}
			lua_settop(L, t);
		}
		skipHook = skip;
		assert(lua_gettop(L) == t);
		doStringList.clear();
	}
}